

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O0

void __thiscall
quic::Bbr2ProbeBwMode::EnterProbeRefill(Bbr2ProbeBwMode *this,uint64_t probe_up_rounds,QuicTime now)

{
  uint64_t probe_up_rounds_local;
  Bbr2ProbeBwMode *this_local;
  QuicTime now_local;
  
  this_local = (Bbr2ProbeBwMode *)now.time_;
  if ((this->cycle_).phase == PROBE_DOWN) {
    ExitProbeDown(this);
  }
  (this->cycle_).phase = PROBE_REFILL;
  (this->cycle_).rounds_in_phase = 0;
  QuicTime::operator=(&(this->cycle_).phase_start_time,(QuicTime *)&this_local);
  (this->cycle_).is_sample_from_probing = false;
  this->last_cycle_stopped_risky_probe_ = false;
  Bbr2NetworkModel::clear_bandwidth_lo((this->super_Bbr2ModeBase).model_);
  Bbr2NetworkModel::clear_inflight_lo((this->super_Bbr2ModeBase).model_);
  (this->cycle_).probe_up_rounds = probe_up_rounds;
  (this->cycle_).probe_up_acked = 0;
  Bbr2NetworkModel::RestartRound((this->super_Bbr2ModeBase).model_);
  return;
}

Assistant:

void Bbr2ProbeBwMode::EnterProbeRefill(uint64_t probe_up_rounds, QuicTime now) {
  if (cycle_.phase == CyclePhase::PROBE_DOWN) {
    ExitProbeDown();
  }
 /* QUIC_DVLOG(2) << sender_ << " Phase change: " << cycle_.phase << " ==> "
                << CyclePhase::PROBE_REFILL << " after "
                << now - cycle_.phase_start_time << ", or "
                << cycle_.rounds_in_phase
                << " rounds. probe_up_rounds:" << probe_up_rounds << "  @ "
                << now;*/
  cycle_.phase = CyclePhase::PROBE_REFILL;
  cycle_.rounds_in_phase = 0;
  cycle_.phase_start_time = now;
  cycle_.is_sample_from_probing = false;
  last_cycle_stopped_risky_probe_ = false;

  model_->clear_bandwidth_lo();
  model_->clear_inflight_lo();
  cycle_.probe_up_rounds = probe_up_rounds;
  cycle_.probe_up_acked = 0;
  model_->RestartRound();
}